

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindAggregateState
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer pcVar1;
  LogicalType *pLVar2;
  ScalarFunction *pSVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  reference pvVar7;
  pointer pEVar8;
  pointer pEVar9;
  aggregate_state_t *paVar10;
  Catalog *this_00;
  idx_t offset;
  BoundConstantExpression *this_01;
  InternalException *pIVar11;
  BinderException *pBVar12;
  LogicalType *pLVar13;
  pointer pLVar14;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *other;
  LogicalType *arg_type;
  pointer pLVar15;
  aggregate_state_t state_type;
  optional_idx best_function;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  args;
  FunctionBinder function_binder;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> bind_info;
  AggregateFunction bound_aggr;
  ErrorData error;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_410;
  ClientContext *local_408;
  pointer local_400;
  string local_3f8;
  LogicalType local_3d8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3c0;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_3a8;
  LogicalType *local_3a0;
  ScalarFunction *local_398;
  optional_idx local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  Value local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  FunctionBinder local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  element_type *local_298 [8];
  undefined1 local_258 [240];
  bind_aggregate_function_t local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  string local_128;
  string local_108;
  string local_e8;
  LogicalType local_c8;
  undefined1 local_b0 [56];
  char local_78 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  local_408 = context;
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  pLVar13 = &pEVar8->return_type;
  pLVar15 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start;
  pLVar14 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_400 = pEVar8;
  local_398 = bound_function;
  if (pLVar15 != pLVar14) {
    pLVar2 = &pEVar8->return_type;
    do {
      if (pLVar15 != pLVar13) {
        pLVar15->id_ = (pEVar8->return_type).id_;
        pLVar15->physical_type_ = (pEVar8->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&pLVar15->type_info_,&pLVar2->type_info_)
        ;
        pEVar8 = local_400;
      }
      pLVar15 = pLVar15 + 1;
    } while (pLVar15 != pLVar14);
  }
  if (pLVar13->id_ != AGGREGATE_STATE) {
    pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
    local_258._0_8_ = local_258 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_258,"Can only FINALIZE aggregate state, not %s","");
    LogicalType::ToString_abi_cxx11_(&local_e8,pLVar13);
    BinderException::BinderException<std::__cxx11::string>(pBVar12,(string *)local_258,&local_e8);
    __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((long)(arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x10) {
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    bVar5 = LogicalType::operator==(&pEVar8->return_type,&pEVar9->return_type);
    if (!bVar5) {
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,1);
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar7);
      if ((pEVar8->return_type).id_ != BLOB) {
        pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
        local_258._0_8_ = local_258 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_258,
                   "Cannot COMBINE aggregate states from different functions, %s <> %s","");
        pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,0);
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar7);
        LogicalType::ToString_abi_cxx11_(&local_108,&pEVar8->return_type);
        pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,1);
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar7);
        LogicalType::ToString_abi_cxx11_(&local_128,&pEVar8->return_type);
        BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                  (pBVar12,(string *)local_258,&local_108,&local_128);
        __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  local_3a0 = pLVar13;
  paVar10 = AggregateStateType::GetStateType(pLVar13);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  pcVar1 = (paVar10->function_name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f8,pcVar1,pcVar1 + (paVar10->function_name)._M_string_length);
  LogicalType::LogicalType(&local_3d8,&paVar10->return_type);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3c0,
             &(paVar10->bound_argument_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  this_00 = Catalog::GetSystemCatalog(local_408);
  pcVar1 = local_258 + 0x10;
  local_258._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"main","");
  local_b0._0_8_ =
       Catalog::GetEntry<duckdb::AggregateFunctionCatalogEntry>
                 (this_00,local_408,(string *)local_258,&local_3f8,THROW_EXCEPTION,
                  (QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true> *)local_b0);
  uVar4 = local_b0._0_8_;
  if ((pointer)local_258._0_8_ != pcVar1) {
    operator_delete((void *)local_258._0_8_);
  }
  if ((((FunctionEntry *)uVar4)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.type
      != AGGREGATE_FUNCTION_ENTRY) {
    pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
    local_258._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_258,"Could not find aggregate %s","");
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b8,local_3f8._M_dataplus._M_p,
               local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
    InternalException::InternalException<std::__cxx11::string>
              (pIVar11,(string *)local_258,&local_2b8);
    __cxa_throw(pIVar11,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ErrorData::ErrorData((ErrorData *)local_b0);
  FunctionBinder::FunctionBinder(&local_2c8,local_408);
  local_390 = FunctionBinder::BindFunction
                        (&local_2c8,
                         &(((FunctionEntry *)uVar4)->super_StandardEntry).super_InCatalogEntry.
                          super_CatalogEntry.name,(AggregateFunctionSet *)(uVar4 + 0x158),
                         (vector<duckdb::LogicalType,_true> *)&local_3c0,(ErrorData *)local_b0);
  if (local_390.index == 0xffffffffffffffff) {
    pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
    local_258._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_258,"Could not re-bind exported aggregate %s: %s","");
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e8,local_3f8._M_dataplus._M_p,
               local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_308,local_b0._40_8_,(char *)(local_b0._48_8_ + local_b0._40_8_));
    InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
              (pIVar11,(string *)local_258,&local_2e8,&local_308);
    __cxa_throw(pIVar11,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  offset = optional_idx::GetIndex(&local_390);
  FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
            ((AggregateFunction *)local_258,
             (FunctionSet<duckdb::AggregateFunction> *)(uVar4 + 0x158),offset);
  if (local_168 != (bind_aggregate_function_t)0x0) {
    local_388 = 0;
    uStack_380 = 0;
    local_378 = 0;
    local_3a8._M_head_impl = (FunctionData *)this;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::reserve((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_388,
              ((long)local_3c0.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_3c0.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    pLVar15 = local_3c0.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (local_3c0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_3c0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pLVar14 = local_3c0.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        LogicalType::LogicalType(&local_c8,pLVar14);
        Value::Value((Value *)local_298,&local_c8);
        this_01 = (BoundConstantExpression *)operator_new(0x98);
        Value::Value(&local_368,(Value *)local_298);
        BoundConstantExpression::BoundConstantExpression(this_01,&local_368);
        Value::~Value(&local_368);
        local_410._M_head_impl = (Expression *)this_01;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_388,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_410);
        if ((BoundConstantExpression *)local_410._M_head_impl != (BoundConstantExpression *)0x0) {
          (*(((Expression *)&(local_410._M_head_impl)->super_BaseExpression)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        local_410._M_head_impl = (Expression *)0x0;
        Value::~Value((Value *)local_298);
        LogicalType::~LogicalType(&local_c8);
        pLVar14 = pLVar14 + 1;
      } while (pLVar14 != pLVar15);
    }
    (*local_168)((ClientContext *)local_298,(AggregateFunction *)local_408,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_258);
    this = (duckdb *)local_3a8._M_head_impl;
    if (local_298[0] != (element_type *)0x0) {
      pBVar12 = (BinderException *)__cxa_allocate_exception(0x10);
      local_368.type_._0_8_ =
           &local_368.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_368,
                 "Aggregate function with bind info not supported yet in aggregate state export","")
      ;
      BinderException::BinderException(pBVar12,(string *)&local_368);
      __cxa_throw(pBVar12,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_388);
  }
  bVar5 = LogicalType::operator==((LogicalType *)(local_258 + 0x90),&local_3d8);
  if ((!bVar5) ||
     (local_258._80_8_ - local_258._72_8_ !=
      (long)local_3c0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_3c0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start)) {
LAB_00a22090:
    pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
    local_368.type_._0_8_ =
         &local_368.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_368,"Type mismatch for exported aggregate %s","");
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_328,local_3f8._M_dataplus._M_p,
               local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
    InternalException::InternalException<std::__cxx11::string>
              (pIVar11,(string *)&local_368,&local_328);
    __cxa_throw(pIVar11,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar5 = local_258._72_8_ == local_258._80_8_;
  if (!bVar5) {
    bVar5 = LogicalType::operator==
                      ((LogicalType *)local_258._72_8_,
                       local_3c0.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (bVar5) {
      do {
        pLVar13 = (LogicalType *)(local_258._72_8_ + 0x18);
        bVar5 = pLVar13 == (LogicalType *)local_258._80_8_;
        if (bVar5) goto LAB_00a22123;
        bVar5 = LogicalType::operator==
                          (pLVar13,local_3c0.
                                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1);
        local_258._72_8_ = pLVar13;
        local_3c0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_3c0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      } while (bVar5);
    }
    goto LAB_00a22090;
  }
LAB_00a22123:
  pSVar3 = local_398;
  if (!bVar5) goto LAB_00a22090;
  iVar6 = ::std::__cxx11::string::compare
                    ((char *)&(local_398->super_BaseScalarFunction).super_SimpleFunction.
                              super_Function.name);
  if (iVar6 == 0) {
    if ((ScalarFunction *)local_258 == pSVar3) goto LAB_00a221a8;
    other = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(local_258 + 0x98);
    (pSVar3->super_BaseScalarFunction).return_type.id_ = local_258[0x90];
    (pSVar3->super_BaseScalarFunction).return_type.physical_type_ = local_258[0x91];
  }
  else {
    if (&(pSVar3->super_BaseScalarFunction).return_type == local_3a0) goto LAB_00a221a8;
    (pSVar3->super_BaseScalarFunction).return_type.id_ = (local_400->return_type).id_;
    (pSVar3->super_BaseScalarFunction).return_type.physical_type_ =
         (local_400->return_type).physical_type_;
    other = &(local_400->return_type).type_info_;
  }
  shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
            (&(pSVar3->super_BaseScalarFunction).return_type.type_info_,other);
LAB_00a221a8:
  local_298[0] = (element_type *)(*(code *)local_258._176_8_)();
  make_uniq<duckdb::ExportAggregateBindData,duckdb::AggregateFunction&,unsigned_long>
            ((duckdb *)&local_368,(AggregateFunction *)local_258,(unsigned_long *)local_298);
  uVar4 = local_368.type_._0_8_;
  local_368.type_.id_ = INVALID;
  local_368.type_.physical_type_ = ~INVALID;
  local_368.type_._2_6_ = 0;
  *(undefined8 *)this = uVar4;
  local_258._0_8_ = &PTR__AggregateFunction_0199c528;
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_258);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_68);
  if ((char *)local_b0._40_8_ != local_78) {
    operator_delete((void *)local_b0._40_8_);
  }
  if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x18) {
    operator_delete((void *)local_b0._8_8_);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3c0);
  LogicalType::~LogicalType(&local_3d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> BindAggregateState(ClientContext &context, ScalarFunction &bound_function,
                                                   vector<unique_ptr<Expression>> &arguments) {

	// grab the aggregate type and bind the aggregate again

	// the aggregate name and types are in the logical type of the aggregate state, make sure its sane
	auto &arg_return_type = arguments[0]->return_type;
	for (auto &arg_type : bound_function.arguments) {
		arg_type = arg_return_type;
	}

	if (arg_return_type.id() != LogicalTypeId::AGGREGATE_STATE) {
		throw BinderException("Can only FINALIZE aggregate state, not %s", arg_return_type.ToString());
	}
	// combine
	if (arguments.size() == 2 && arguments[0]->return_type != arguments[1]->return_type &&
	    arguments[1]->return_type.id() != LogicalTypeId::BLOB) {
		throw BinderException("Cannot COMBINE aggregate states from different functions, %s <> %s",
		                      arguments[0]->return_type.ToString(), arguments[1]->return_type.ToString());
	}

	// following error states are only reachable when someone messes up creating the state_type
	// which is impossible from SQL

	auto state_type = AggregateStateType::GetStateType(arg_return_type);

	// now we can look up the function in the catalog again and bind it
	auto &func = Catalog::GetSystemCatalog(context).GetEntry<AggregateFunctionCatalogEntry>(context, DEFAULT_SCHEMA,
	                                                                                        state_type.function_name);
	if (func.type != CatalogType::AGGREGATE_FUNCTION_ENTRY) {
		throw InternalException("Could not find aggregate %s", state_type.function_name);
	}
	auto &aggr = func.Cast<AggregateFunctionCatalogEntry>();

	ErrorData error;

	FunctionBinder function_binder(context);
	auto best_function =
	    function_binder.BindFunction(aggr.name, aggr.functions, state_type.bound_argument_types, error);
	if (!best_function.IsValid()) {
		throw InternalException("Could not re-bind exported aggregate %s: %s", state_type.function_name,
		                        error.Message());
	}
	auto bound_aggr = aggr.functions.GetFunctionByOffset(best_function.GetIndex());
	if (bound_aggr.bind) {
		// FIXME: this is really hacky
		// but the aggregate state export needs a rework around how it handles more complex aggregates anyway
		vector<unique_ptr<Expression>> args;
		args.reserve(state_type.bound_argument_types.size());
		for (auto &arg_type : state_type.bound_argument_types) {
			args.push_back(make_uniq<BoundConstantExpression>(Value(arg_type)));
		}
		auto bind_info = bound_aggr.bind(context, bound_aggr, args);
		if (bind_info) {
			throw BinderException("Aggregate function with bind info not supported yet in aggregate state export");
		}
	}

	if (bound_aggr.return_type != state_type.return_type || bound_aggr.arguments != state_type.bound_argument_types) {
		throw InternalException("Type mismatch for exported aggregate %s", state_type.function_name);
	}

	if (bound_function.name == "finalize") {
		bound_function.return_type = bound_aggr.return_type;
	} else {
		D_ASSERT(bound_function.name == "combine");
		bound_function.return_type = arg_return_type;
	}

	return make_uniq<ExportAggregateBindData>(bound_aggr, bound_aggr.state_size(bound_aggr));
}